

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::GrowEdgeFaceArray(ON_SubDHeap *this,ON_SubDEdge *e,size_t capacity)

{
  ON__UINT_PTR *pOVar1;
  int local_44;
  ON__UINT_PTR *a;
  size_t xcapacity;
  size_t capacity_local;
  ON_SubDEdge *e_local;
  ON_SubDHeap *this_local;
  
  xcapacity = capacity;
  capacity_local = (size_t)e;
  e_local = (ON_SubDEdge *)this;
  if (e == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    if (capacity == 0) {
      xcapacity = (size_t)(int)(e->m_face_count + 1);
    }
    if ((ulong)(long)(int)(e->m_facex_capacity + 2) < xcapacity) {
      a = (ON__UINT_PTR *)(xcapacity - 2);
      if (e->m_face_count < 3) {
        local_44 = 0;
      }
      else {
        local_44 = e->m_face_count - 2;
      }
      pOVar1 = ResizeArray(this,(long)local_44,(ulong)e->m_facex_capacity,&e->m_facex->m_ptr,
                           (size_t *)&a);
      if (pOVar1 == (ON__UINT_PTR *)0x0) {
        *(undefined2 *)(capacity_local + 100) = 0;
        *(undefined2 *)(capacity_local + 0x66) = 0;
        *(undefined8 *)(capacity_local + 0x78) = 0;
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        *(ON__UINT_PTR **)(capacity_local + 0x78) = pOVar1;
        *(short *)(capacity_local + 0x66) = (short)a;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::GrowEdgeFaceArray(
  ON_SubDEdge* e,
  size_t capacity
  )
{
  if ( nullptr == e)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == capacity )
    capacity = e->m_face_count+1;
  if ( capacity <= (size_t)(2 + e->m_facex_capacity))
    return true;
  size_t xcapacity = capacity-2;
  ON__UINT_PTR* a = ResizeArray((e->m_face_count>2) ? (e->m_face_count-2) : 0,e->m_facex_capacity,(ON__UINT_PTR*)e->m_facex,&xcapacity);
  if ( nullptr == a )
  {
    e->m_face_count = 0;
    e->m_facex_capacity = 0;
    e->m_facex = nullptr;
    return ON_SUBD_RETURN_ERROR(false);
  }
  e->m_facex = (ON_SubDFacePtr*)a;
  e->m_facex_capacity = (unsigned short)xcapacity;
  return true;
}